

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
::UntypedPerformAction
          (FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  *pAVar1;
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  action;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::
  function<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
  function((function<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            *)&local_30,
           (function<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            *)untyped_action);
  pAVar1 = ActionResultHolder<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&>
           ::
           PerformAction<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>
                     ((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                       *)&local_30,(ArgumentTuple *)untyped_args);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }